

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O1

iterator * __thiscall
skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
::find(iterator *__return_storage_ptr__,
      skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
      *this,int find_key)

{
  pointer ppSVar1;
  int iVar2;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar3;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar4;
  
  ppSVar1 = (this->key).
            super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->key).
      super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppSVar1) {
    pSVar3 = ppSVar1[-1];
    while (pSVar3->down !=
           (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0) {
      do {
        pSVar4 = pSVar3;
        pSVar3 = pSVar4->next;
        if (pSVar3 == (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) break;
      } while (pSVar3->val < find_key);
      pSVar3 = pSVar4->down;
    }
    do {
      pSVar3 = pSVar3->next;
      if (pSVar3 == (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) goto LAB_001034b7;
    } while (pSVar3->val < find_key);
    if ((pSVar3 != (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0) && (pSVar3->val == find_key)) {
      __return_storage_ptr__->node = pSVar3;
      __return_storage_ptr__->node_count_ = 0;
      __return_storage_ptr__->node_count_ref_ = 0;
      iVar2 = pSVar3->count + -1;
      __return_storage_ptr__->node_count_ = iVar2;
      __return_storage_ptr__->node_count_ref_ = iVar2;
      goto LAB_001034c0;
    }
  }
LAB_001034b7:
  __return_storage_ptr__->node =
       (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  __return_storage_ptr__->node_count_ = 0;
  __return_storage_ptr__->node_count_ref_ = 0;
LAB_001034c0:
  __return_storage_ptr__->reverse_ = false;
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, V, X>::iterator skiplist<T, V, X>::find(T find_key) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T, V>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, find_key))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, find_key))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, find_key, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}